

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O0

void __thiscall boost::detail::shared_state_base::notify_deferred(shared_state_base *this)

{
  mutex *in_RDI;
  unique_lock<boost::mutex> lock;
  unique_lock<boost::mutex> *this_00;
  unique_lock<boost::mutex> *in_stack_ffffffffffffffe8;
  shared_state_base *in_stack_fffffffffffffff0;
  
  this_00 = (unique_lock<boost::mutex> *)&stack0xffffffffffffffe8;
  unique_lock<boost::mutex>::unique_lock(this_00,in_RDI);
  mark_finished_internal(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  unique_lock<boost::mutex>::~unique_lock(this_00);
  return;
}

Assistant:

void notify_deferred()
            {
              boost::unique_lock<boost::mutex> lock(this->mutex);
              mark_finished_internal(lock);
            }